

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

shared_ptr<slang::syntax::SyntaxTree> __thiscall
slang::syntax::SyntaxRewriter<TestRewriter>::transform
          (SyntaxRewriter<TestRewriter> *this,shared_ptr<slang::syntax::SyntaxTree> *tree,
          SourceLibrary *library)

{
  bool bVar1;
  element_type *peVar2;
  SourceManager *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  TestRewriter *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> sVar5;
  SourceLibrary *in_stack_00000038;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *in_stack_00000040;
  ChangeCollection *in_stack_00000048;
  shared_ptr<slang::syntax::SyntaxTree> *in_stack_00000050;
  BumpAllocator *in_stack_00000058;
  TestRewriter *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  this_00 = in_RDI;
  peVar2 = std::
           __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x7aef68);
  pSVar3 = SyntaxTree::sourceManager(peVar2);
  *(SourceManager **)(in_RSI + 0x18) = pSVar3;
  detail::ChangeCollection::clear((ChangeCollection *)this_00);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::clear((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           *)0x7aef93);
  peVar2 = std::
           __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x7aef9d);
  SyntaxTree::root(peVar2);
  SyntaxNode::visit<TestRewriter>((SyntaxNode *)this_00,in_RDI);
  bVar1 = detail::ChangeCollection::empty((ChangeCollection *)this_00);
  if (bVar1) {
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)this_00,
               (shared_ptr<slang::syntax::SyntaxTree> *)in_RDI);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    sVar5 = detail::transformTree
                      (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                       in_stack_00000038);
    _Var4 = sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> transform(const std::shared_ptr<SyntaxTree>& tree,
                                          const SourceLibrary* library = nullptr) {
        sourceManager = &tree->sourceManager();
        commits.clear();
        tempTrees.clear();

        tree->root().visit(*DERIVED);

        if (commits.empty())
            return tree;

        return transformTree(std::move(alloc), tree, commits, tempTrees, library);
    }